

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int delete_property(JSContext *ctx,JSObject *p,JSAtom atom)

{
  JSProperty *pJVar1;
  undefined8 *puVar2;
  byte bVar3;
  uint16_t uVar4;
  list_head *plVar5;
  list_head *plVar6;
  JSRuntime *pJVar7;
  JSClassExoticMethods *pJVar8;
  _func_int_JSContext_ptr_JSValue_JSAtom *UNRECOVERED_JUMPTABLE;
  JSVarRef **ppJVar9;
  JSVarRef *pJVar10;
  JSValueUnion JVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  JSObject *pJVar14;
  int64_t iVar15;
  BOOL BVar16;
  int iVar17;
  uint uVar18;
  void *__s;
  JSProperty *pJVar19;
  uint uVar20;
  JSShape *pJVar21;
  JSShapeProperty *pJVar22;
  JSProperty *pJVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  JSShape *pJVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  JSValue JVar31;
  JSValue v;
  JSShapeProperty *pr;
  uint32_t idx;
  JSShapeProperty *local_68;
  JSObject *local_60;
  uint local_54;
  ulong local_50;
  JSShape *local_48;
  size_t local_40;
  ulong local_38;
  
  do {
    pJVar27 = p->shape;
    uVar30 = ~(ulong)(pJVar27->prop_hash_mask & atom);
    uVar28 = (ulong)(uint)(&(pJVar27->header).ref_count)[uVar30];
    if (uVar28 != 0) {
      pJVar27 = pJVar27 + 1;
      local_68 = (JSShapeProperty *)((long)pJVar27 + uVar28 * 8 + -8);
      local_60 = p;
      if (*(JSAtom *)((long)pJVar27 + uVar28 * 8 + -4) == atom) {
        pJVar22 = (JSShapeProperty *)0x0;
LAB_00120460:
        lVar29 = uVar28 - 1;
        if ((local_68->field_0x3 & 4) == 0) {
          return 0;
        }
        iVar17 = js_shape_prepare_update(ctx,p,&local_68);
        pJVar14 = local_60;
        if (pJVar22 == (JSShapeProperty *)0x0) {
          if (iVar17 != 0) {
            return -1;
          }
          pJVar21 = local_60->shape;
          (&(pJVar21->header).ref_count)[uVar30] = *(uint *)local_68 & 0x3ffffff;
        }
        else {
          if (iVar17 != 0) {
            return -1;
          }
          pJVar21 = local_60->shape;
          uVar28 = (long)pJVar22 - (long)pJVar27 & 0x7fffffff8;
          *(uint *)((long)&pJVar21[1].header.ref_count + uVar28) =
               *(uint *)((long)&pJVar21[1].header.ref_count + uVar28) & 0xfc000000 |
               *(uint *)local_68 & 0x3ffffff;
        }
        pJVar21->deleted_prop_count = pJVar21->deleted_prop_count + 1;
        pJVar19 = local_60->prop;
        free_property(ctx->rt,pJVar19 + lVar29,*(uint *)local_68 >> 0x1a);
        JS_FreeAtom(ctx,local_68->atom);
        *(uint *)local_68 = *(uint *)local_68 & 0x3ffffff;
        local_68->atom = 0;
        *(undefined4 *)&pJVar19[lVar29].u = 0;
        pJVar19[lVar29].u.value.tag = 3;
        if (pJVar21->deleted_prop_count < 8) {
          return 1;
        }
        if ((uint)pJVar21->deleted_prop_count < (uint)pJVar21->prop_count >> 1) {
          return 1;
        }
        pJVar27 = pJVar14->shape;
        uVar20 = pJVar27->prop_count - pJVar27->deleted_prop_count;
        uVar26 = 2;
        if (2 < (int)uVar20) {
          uVar26 = uVar20;
        }
        uVar20 = pJVar27->prop_hash_mask + 1;
        do {
          uVar18 = uVar20;
          uVar28 = (ulong)uVar18;
          uVar20 = uVar18 >> 1;
        } while (uVar26 <= uVar18 >> 1);
        local_38 = (ulong)uVar26;
        local_40 = uVar28 * 4;
        __s = js_malloc(ctx,local_40 + local_38 * 8 + 0x40);
        if (__s == (void *)0x0) {
          return 1;
        }
        local_48 = (JSShape *)((long)__s + uVar28 * 4);
        plVar5 = (pJVar27->header).link.prev;
        plVar6 = (pJVar27->header).link.next;
        plVar5->next = plVar6;
        plVar6->prev = plVar5;
        (pJVar27->header).link.prev = (list_head *)0x0;
        (pJVar27->header).link.next = (list_head *)0x0;
        uVar12 = *(undefined8 *)&pJVar27->prop_hash_mask;
        uVar13 = *(undefined8 *)&pJVar27->prop_count;
        pJVar14 = pJVar27->proto;
        puVar2 = (undefined8 *)((long)__s + uVar28 * 4 + 0x30);
        *puVar2 = pJVar27->shape_hash_next;
        puVar2[1] = pJVar14;
        puVar2 = (undefined8 *)((long)__s + uVar28 * 4 + 0x20);
        *puVar2 = uVar12;
        puVar2[1] = uVar13;
        uVar12 = *(undefined8 *)&pJVar27->header;
        plVar5 = (pJVar27->header).link.prev;
        uVar13 = *(undefined8 *)&pJVar27->is_hashed;
        puVar2 = (undefined8 *)((long)__s + uVar28 * 4 + 0x10);
        *puVar2 = (pJVar27->header).link.next;
        puVar2[1] = uVar13;
        puVar2 = (undefined8 *)((long)__s + uVar28 * 4);
        *puVar2 = uVar12;
        puVar2[1] = plVar5;
        plVar5 = (list_head *)((long)__s + uVar28 * 4 + 8);
        pJVar7 = ctx->rt;
        plVar6 = (pJVar7->gc_obj_list).prev;
        plVar6->next = plVar5;
        *(list_head **)((long)__s + uVar28 * 4 + 8) = plVar6;
        *(list_head **)((long)__s + uVar28 * 4 + 0x10) = &pJVar7->gc_obj_list;
        (pJVar7->gc_obj_list).prev = plVar5;
        iVar17 = 0;
        local_50 = uVar28;
        memset(__s,0,local_40);
        pJVar14 = local_60;
        uVar20 = *(uint *)((long)__s + local_50 * 4 + 0x28);
        if (uVar20 != 0) {
          pJVar19 = local_60->prop;
          pJVar21 = local_48 + 1;
          uVar28 = 0;
          uVar30 = 0;
          pJVar23 = pJVar19;
          do {
            iVar17 = *(int *)(&pJVar27[1].header.field_0x4 + uVar28 * 8);
            if (iVar17 != 0) {
              *(int *)&(pJVar21->header).field_0x4 = iVar17;
              uVar20 = (&pJVar27[1].header.ref_count)[uVar28 * 2] & 0xfc000000;
              (pJVar21->header).ref_count = (pJVar21->header).ref_count & 0x3ffffffU | uVar20;
              uVar24 = ~(ulong)(*(uint *)(&pJVar27[1].header.field_0x4 + uVar28 * 8) & uVar18 - 1);
              (pJVar21->header).ref_count =
                   (&(local_48->header).ref_count)[uVar24] & 0x3ffffffU | uVar20;
              uVar25 = (int)uVar30 + 1;
              (&(local_48->header).ref_count)[uVar24] = uVar25;
              iVar15 = (pJVar23->u).value.tag;
              pJVar1 = pJVar19 + uVar30;
              (pJVar1->u).value.u = (pJVar23->u).value.u;
              (pJVar1->u).value.tag = iVar15;
              pJVar21 = (JSShape *)&(pJVar21->header).link;
              uVar20 = local_48->prop_count;
              uVar30 = (ulong)uVar25;
            }
            iVar17 = (int)uVar30;
            uVar28 = uVar28 + 1;
            pJVar23 = pJVar23 + 1;
          } while (uVar28 < uVar20);
        }
        local_48->prop_hash_mask = uVar18 - 1;
        local_48->prop_size = uVar26;
        local_48->deleted_prop_count = 0;
        local_48->prop_count = iVar17;
        local_60->shape = local_48;
        (*(ctx->rt->mf).js_free)
                  (&ctx->rt->malloc_state,
                   &(pJVar27->header).ref_count + ~(ulong)pJVar27->prop_hash_mask);
        pJVar19 = (JSProperty *)js_realloc(ctx,pJVar14->prop,local_38 << 4);
        if (pJVar19 == (JSProperty *)0x0) {
          return 1;
        }
        pJVar14->prop = pJVar19;
        return 1;
      }
      while (pJVar22 = local_68, uVar28 = (ulong)*(uint *)pJVar22 & 0x3ffffff, local_68 = pJVar22,
            (*(uint *)pJVar22 & 0x3ffffff) != 0) {
        local_68 = (JSShapeProperty *)((long)pJVar27 + uVar28 * 8 + -8);
        if (*(JSAtom *)((long)pJVar27 + uVar28 * 8 + -4) == atom) goto LAB_00120460;
      }
    }
    bVar3 = (p->field_0).header.dummy1;
    if ((bVar3 & 4) == 0) {
      return 1;
    }
    if ((bVar3 & 8) == 0) {
      pJVar8 = ctx->rt->class_array[(p->field_0).header.dummy2].exotic;
      if (pJVar8 == (JSClassExoticMethods *)0x0) {
        return 1;
      }
      UNRECOVERED_JUMPTABLE = pJVar8->delete_property;
      if (UNRECOVERED_JUMPTABLE == (_func_int_JSContext_ptr_JSValue_JSAtom *)0x0) {
        return 1;
      }
      JVar31.tag = -1;
      JVar31.u.ptr = p;
      iVar17 = (*UNRECOVERED_JUMPTABLE)(ctx,JVar31,atom);
      return iVar17;
    }
    BVar16 = JS_AtomIsArrayIndex(ctx,&local_54,atom);
    if (BVar16 == 0) {
      return 1;
    }
    uVar26 = (p->u).array.count;
    if (uVar26 <= local_54) {
      return 1;
    }
    uVar4 = (p->field_0).header.dummy2;
    if ((uVar4 != 8) && (uVar4 != 2)) {
      return 0;
    }
    if (local_54 == uVar26 - 1) {
      ppJVar9 = (p->u).func.var_refs;
      pJVar10 = ppJVar9[(ulong)local_54 * 2 + 1];
      if (0xfffffff4 < (uint)pJVar10) {
        JVar11 = (JSValueUnion)((JSValueUnion *)(ppJVar9 + (ulong)local_54 * 2))->ptr;
        iVar17 = *JVar11.ptr;
        *(int *)JVar11.ptr = iVar17 + -1;
        if (iVar17 < 2) {
          v.tag = (int64_t)pJVar10;
          v.u.ptr = JVar11.ptr;
          __JS_FreeValueRT(ctx->rt,v);
        }
      }
      (p->u).array.count = local_54;
      return 1;
    }
    iVar17 = convert_fast_array_to_array(ctx,p);
    if (iVar17 != 0) {
      return -1;
    }
  } while( true );
}

Assistant:

static int delete_property(JSContext *ctx, JSObject *p, JSAtom atom)
{
    JSShape *sh;
    JSShapeProperty *pr, *lpr, *prop;
    JSProperty *pr1;
    uint32_t lpr_idx;
    intptr_t h, h1;

 redo:
    sh = p->shape;
    h1 = atom & sh->prop_hash_mask;
    h = prop_hash_end(sh)[-h1 - 1];
    prop = get_shape_prop(sh);
    lpr = NULL;
    lpr_idx = 0;   /* prevent warning */
    while (h != 0) {
        pr = &prop[h - 1];
        if (likely(pr->atom == atom)) {
            /* found ! */
            if (!(pr->flags & JS_PROP_CONFIGURABLE))
                return FALSE;
            /* realloc the shape if needed */
            if (lpr)
                lpr_idx = lpr - get_shape_prop(sh);
            if (js_shape_prepare_update(ctx, p, &pr))
                return -1;
            sh = p->shape;
            /* remove property */
            if (lpr) {
                lpr = get_shape_prop(sh) + lpr_idx;
                lpr->hash_next = pr->hash_next;
            } else {
                prop_hash_end(sh)[-h1 - 1] = pr->hash_next;
            }
            sh->deleted_prop_count++;
            /* free the entry */
            pr1 = &p->prop[h - 1];
            free_property(ctx->rt, pr1, pr->flags);
            JS_FreeAtom(ctx, pr->atom);
            /* put default values */
            pr->flags = 0;
            pr->atom = JS_ATOM_NULL;
            pr1->u.value = JS_UNDEFINED;

            /* compact the properties if too many deleted properties */
            if (sh->deleted_prop_count >= 8 &&
                sh->deleted_prop_count >= ((unsigned)sh->prop_count / 2)) {
                compact_properties(ctx, p);
            }
            return TRUE;
        }
        lpr = pr;
        h = pr->hash_next;
    }

    if (p->is_exotic) {
        if (p->fast_array) {
            uint32_t idx;
            if (JS_AtomIsArrayIndex(ctx, &idx, atom) &&
                idx < p->u.array.count) {
                if (p->class_id == JS_CLASS_ARRAY ||
                    p->class_id == JS_CLASS_ARGUMENTS) {
                    /* Special case deleting the last element of a fast Array */
                    if (idx == p->u.array.count - 1) {
                        JS_FreeValue(ctx, p->u.array.u.values[idx]);
                        p->u.array.count = idx;
                        return TRUE;
                    }
                    if (convert_fast_array_to_array(ctx, p))
                        return -1;
                    goto redo;
                } else {
                    return FALSE;
                }
            }
        } else {
            const JSClassExoticMethods *em = ctx->rt->class_array[p->class_id].exotic;
            if (em && em->delete_property) {
                return em->delete_property(ctx, JS_MKPTR(JS_TAG_OBJECT, p), atom);
            }
        }
    }
    /* not found */
    return TRUE;
}